

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  Context *orig;
  Detail *pDVar1;
  ArrayPtr<const_unsigned_char> content;
  Type TVar2;
  char *pcVar3;
  String *extraout_RDX;
  String *extraout_RDX_00;
  String *params;
  Detail *detail;
  Detail *pDVar4;
  Array<char> local_58;
  ArrayDisposer *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  uchar *puStack_30;
  
  (this->ownFile).content.disposer = (ArrayDisposer *)0x0;
  (this->ownFile).content.ptr = (char *)0x0;
  (this->ownFile).content.size_ = 0;
  this->file = other->file;
  TVar2 = other->type;
  this->line = other->line;
  this->type = TVar2;
  heapString(&this->description,&other->description);
  (this->remoteTrace).content.disposer = (ArrayDisposer *)0x0;
  (this->remoteTrace).content.ptr = (char *)0x0;
  (this->remoteTrace).content.size_ = 0;
  (this->context).ptr.disposer = (Disposer *)0x0;
  (this->context).ptr.ptr = (Context *)0x0;
  this->traceCount = other->traceCount;
  this->isFullTrace = false;
  (this->details).builder.endPtr = (Detail *)0x0;
  (this->details).builder.ptr = (Detail *)0x0;
  (this->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  (this->details).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  if ((other->ownFile).content.size_ == 0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = (other->ownFile).content.ptr;
  }
  params = extraout_RDX;
  if (this->file == pcVar3) {
    heapString((String *)&local_58,&other->ownFile);
    Array<char>::operator=((Array<char> *)this,&local_58);
    Array<char>::~Array(&local_58);
    if ((this->ownFile).content.size_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (this->ownFile).content.ptr;
    }
    this->file = pcVar3;
    params = extraout_RDX_00;
  }
  if (1 < (other->remoteTrace).content.size_) {
    str<kj::String_const&>((String *)&local_58,(kj *)&other->remoteTrace,params);
    Array<char>::operator=(&(this->remoteTrace).content,&local_58);
    Array<char>::~Array(&local_58);
  }
  memcpy(this->trace,other->trace,(ulong)this->traceCount << 3);
  orig = (other->context).ptr.ptr;
  if (orig != (Context *)0x0) {
    local_58.ptr = in_stack_ffffffffffffffc8;
    heap<kj::Exception::Context_const&>((kj *)&stack0xffffffffffffffc8,orig);
    local_58.size_ = (size_t)puStack_30;
    in_stack_ffffffffffffffc8 = local_58.ptr;
    Own<kj::Exception::Context,_std::nullptr_t>::operator=
              (&(this->context).ptr,(Own<kj::Exception::Context,_std::nullptr_t> *)&local_58);
    if ((uchar *)local_58.size_ != (uchar *)0x0) {
      local_58.size_ = 0;
      (*(code *)**(undefined8 **)local_58.ptr)();
    }
  }
  pDVar1 = (other->details).builder.pos;
  for (pDVar4 = (other->details).builder.ptr; pDVar4 != pDVar1; pDVar4 = pDVar4 + 1) {
    local_58.ptr = (char *)pDVar4->id;
    content.size_ = (size_t)in_stack_ffffffffffffffc8;
    content.ptr = (uchar *)in_stack_ffffffffffffffc0;
    heapArray<unsigned_char>(content);
    Vector<kj::Exception::Detail>::add<kj::Exception::Detail>(&this->details,(Detail *)&local_58);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&local_58.size_);
  }
  return;
}

Assistant:

Exception::Exception(const Exception& other) noexcept
    : file(other.file), line(other.line), type(other.type),
      description(heapString(other.description)), traceCount(other.traceCount) {
  if (file == other.ownFile.cStr()) {
    ownFile = heapString(other.ownFile);
    file = ownFile.cStr();
  }

  if (other.remoteTrace != nullptr) {
    remoteTrace = kj::str(other.remoteTrace);
  }

  memcpy(trace, other.trace, sizeof(trace[0]) * traceCount);

  KJ_IF_SOME(c, other.context) {
    context = heap(*c);
  }

  for (auto& detail: other.details) {
    details.add(Detail {
      .id = detail.id,
      .value = kj::heapArray(detail.value.asPtr()),
    });
  }
}